

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_object(Dispatch_Engine *this,Boxed_Value *o)

{
  ostream *poVar1;
  char *pcVar2;
  string local_40;
  
  pcVar2 = "const ";
  if (((((o->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->m_type_info).m_flags & 1) == 0) {
    pcVar2 = "";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  type_name_abi_cxx11_(&local_40,this,o);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void dump_object(const Boxed_Value &o) const { std::cout << (o.is_const() ? "const " : "") << type_name(o) << '\n'; }